

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

RGB __thiscall pbrt::RGBFilm::GetPixelRGB(RGBFilm *this,Point2i *p,Float splatScale)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Pixel *pPVar3;
  long lVar4;
  RGB *pRVar5;
  float fVar6;
  undefined1 auVar7 [16];
  RGB RVar8;
  RGB local_18;
  float local_c;
  
  local_c = splatScale;
  pPVar3 = Array2D<pbrt::RGBFilm::Pixel>::operator[]
                     (&this->pixels,(Point2i)p->super_Tuple2<pbrt::Point2,_int>);
  auVar2 = vcvtpd2ps_avx(*(undefined1 (*) [16])pPVar3->rgbSum);
  uVar1 = vmovlps_avx(auVar2);
  local_18.r = (Float)uVar1;
  local_18.g = SUB84(uVar1,4);
  local_18.b = (float)pPVar3->rgbSum[2];
  fVar6 = (float)pPVar3->weightSum;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    auVar7._4_4_ = fVar6;
    auVar7._0_4_ = fVar6;
    auVar7._8_4_ = fVar6;
    auVar7._12_4_ = fVar6;
    auVar2 = vdivps_avx(auVar2,auVar7);
    uVar1 = vmovlps_avx(auVar2);
    local_18.r = (Float)uVar1;
    local_18.g = SUB84(uVar1,4);
    local_18.b = (float)pPVar3->rgbSum[2] / fVar6;
  }
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pRVar5 = &local_18;
    if (((int)lVar4 != 0) && (pRVar5 = (RGB *)&local_18.g, (int)lVar4 != 1)) {
      pRVar5 = (RGB *)&local_18.b;
    }
    pRVar5->r = (float)(((double)local_c *
                        (double)pPVar3->splatRGB[lVar4].bits.super___atomic_base<unsigned_long>._M_i
                        ) / (double)this->filterIntegral + (double)pRVar5->r);
  }
  RVar8 = Mul<pbrt::RGB,3,pbrt::RGB>(&this->outputRGBFromSensorRGB,&local_18);
  return RVar8;
}

Assistant:

PBRT_CPU_GPU
    RGB GetPixelRGB(const Point2i &p, Float splatScale = 1) const {
        const Pixel &pixel = pixels[p];
        RGB rgb(pixel.rgbSum[0], pixel.rgbSum[1], pixel.rgbSum[2]);
        // Normalize _rgb_ with weight sum
        Float weightSum = pixel.weightSum;
        if (weightSum != 0)
            rgb /= weightSum;

        // Add splat value at pixel
        for (int c = 0; c < 3; ++c)
            rgb[c] += splatScale * pixel.splatRGB[c] / filterIntegral;

        // Convert _rgb_ to output RGB color space
        rgb = outputRGBFromSensorRGB * rgb;

        return rgb;
    }